

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

int trad_enc_init(trad_enc_ctx *ctx,char *pw,size_t pw_len)

{
  size_t local_20;
  size_t pw_len_local;
  char *pw_local;
  trad_enc_ctx *ctx_local;
  
  ctx->keys[0] = 0x12345678;
  ctx->keys[1] = 0x23456789;
  ctx->keys[2] = 0x34567890;
  pw_len_local = (size_t)pw;
  for (local_20 = pw_len; local_20 != 0; local_20 = local_20 - 1) {
    trad_enc_update_keys(ctx,*(uint8_t *)pw_len_local);
    pw_len_local = pw_len_local + 1;
  }
  return 0;
}

Assistant:

static int
trad_enc_init(struct trad_enc_ctx *ctx, const char *pw, size_t pw_len,
    const uint8_t *key, size_t key_len, uint8_t *crcchk)
{
	uint8_t header[12];

	if (key_len < 12) {
		*crcchk = 0xff;
		return -1;
	}

	ctx->keys[0] = 305419896L;
	ctx->keys[1] = 591751049L;
	ctx->keys[2] = 878082192L;

	for (;pw_len; --pw_len)
		trad_enc_update_keys(ctx, *pw++);

	trad_enc_decrypt_update(ctx, key, 12, header, 12);
	/* Return the last byte for CRC check. */
	*crcchk = header[11];
	return 0;
}